

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmd.c
# Opt level: O3

int genmmd_(int *neqns,int_t *xadj,shortint *adjncy,int *invp,int *perm,int_t *delta,shortint *dhead
           ,shortint *qsize,shortint *llist,shortint *marker,int_t *maxint,int_t *nofsub)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int_t tag;
  int local_84;
  int local_80;
  int local_7c;
  int *local_78;
  int *local_70;
  int *local_68;
  int local_5c;
  int local_58;
  int local_54;
  int_t *local_50;
  uint *local_48;
  shortint *local_40;
  shortint *local_38;
  
  if (0 < *neqns) {
    *nofsub = 0;
    local_78 = perm;
    local_70 = invp;
    local_68 = delta;
    local_50 = xadj;
    local_40 = adjncy;
    slu_mmdint_(neqns,xadj,adjncy,dhead,invp,perm,qsize,llist,marker);
    uVar2 = *dhead;
    if ((int)uVar2 < 1) {
      iVar13 = 1;
    }
    else {
      iVar13 = -1;
      do {
        uVar6 = (ulong)uVar2;
        uVar2 = local_70[uVar6 - 1];
        marker[uVar6 - 1] = *maxint;
        local_70[uVar6 - 1] = iVar13;
        iVar13 = iVar13 + -1;
      } while (0 < (int)uVar2);
      iVar13 = -iVar13;
    }
    if (iVar13 <= *neqns) {
      tag = 1;
      *dhead = 0;
      local_38 = dhead + -1;
      iVar3 = 2;
      local_48 = (uint *)neqns;
      do {
        iVar9 = iVar3 + -1;
        piVar4 = local_38 + iVar3;
        do {
          iVar9 = iVar9 + 1;
          iVar3 = *piVar4;
          piVar4 = piVar4 + 1;
        } while (iVar3 < 1);
        iVar7 = *local_68 + iVar9;
        lVar10 = 0;
        iVar3 = iVar7;
        iVar8 = tag;
        do {
          lVar5 = (long)iVar9 + -1;
          iVar12 = -iVar9;
          while( true ) {
            iVar1 = dhead[lVar5];
            lVar11 = (long)iVar1;
            local_80 = iVar1;
            if (0 < lVar11) break;
            lVar5 = lVar5 + 1;
            iVar12 = iVar12 + -1;
            if (iVar7 <= lVar5) {
              if (iVar3 < iVar9) {
                iVar3 = iVar9;
              }
              local_84 = iVar3 + 1;
              local_7c = (int)lVar10;
              goto LAB_0010f80b;
            }
          }
          iVar9 = local_70[lVar11 + -1];
          dhead[lVar5] = iVar9;
          if (0 < (long)iVar9) {
            local_78[(long)iVar9 + -1] = iVar12;
          }
          local_70[lVar11 + -1] = -iVar13;
          *nofsub = ((qsize[lVar11 + -1] + *nofsub) - iVar12) + -2;
          uVar2 = *local_48;
          neqns = (int *)local_48;
          if ((int)uVar2 < qsize[lVar11 + -1] + iVar13) goto LAB_0010f5f6;
          tag = iVar8 + 1;
          if (*maxint <= tag) {
            tag = 1;
            if (0 < (int)uVar2) {
              uVar6 = 0;
              do {
                if (marker[uVar6] < *maxint) {
                  marker[uVar6] = 0;
                }
                uVar6 = uVar6 + 1;
              } while (uVar2 != uVar6);
            }
          }
          iVar9 = -iVar12;
          local_5c = (int)lVar10;
          local_58 = tag;
          local_54 = iVar3;
          slu_mmdelm_(&local_80,local_50,local_40,dhead,local_70,local_78,qsize,llist,marker,maxint,
                      &tag);
          iVar13 = iVar13 + qsize[lVar11 + -1];
          llist[lVar11 + -1] = local_5c;
          lVar10 = lVar11;
          iVar3 = local_54;
          iVar8 = local_58;
        } while (-1 < *local_68);
        local_84 = -iVar12;
        local_7c = iVar1;
LAB_0010f80b:
        neqns = (int *)local_48;
        if ((int)*local_48 < iVar13) break;
        slu_mmdupd_(&local_7c,(int *)local_48,local_50,local_40,local_68,&local_84,dhead,local_70,
                    local_78,qsize,llist,marker,maxint,&tag);
        iVar3 = local_84;
      } while( true );
    }
LAB_0010f5f6:
    slu_mmdnum_(neqns,local_78,local_70,qsize);
  }
  return 0;
}

Assistant:

int genmmd_(int *neqns, int_t *xadj, shortint *adjncy, 
	int *invp, int *perm, int_t *delta, shortint *dhead, 
	shortint *qsize, shortint *llist, shortint *marker, int_t *maxint, 
	int_t *nofsub)
{
    /* System generated locals */
    int i__1;

    /* Local variables */
    int_t mdeg, ehead, i, mdlmt, mdnode;
    extern /* Subroutine */
    int slu_mmdelm_(const int_t *mdnode, int_t *xadj, shortint *adjncy,
                    shortint *dhead, int *dforw, int *dbakw, shortint *qsize,
                    shortint *llist, shortint *marker, const int_t *maxint, const int_t *tag),
    slu_mmdupd_(const int_t *ehead, const int *neqns, int_t *xadj,
                shortint *adjncy, const int_t *delta, int_t *mdeg, shortint *dhead,
                int *dforw, int *dbakw, shortint *qsize, shortint *llist,
                shortint *marker, const int_t *maxint, int_t *tag),
    slu_mmdint_(const int *neqns, int_t *xadj, shortint *adjncy,
                shortint *dhead, int *dforw, int *dbakw, shortint *qsize,
                shortint *llist, shortint *marker),
    slu_mmdnum_(const int *neqns, int *perm, int *invp, shortint *qsize);

    int_t nextmd, tag, num;

/* *************************************************************** */


/* *************************************************************** */

    /* Parameter adjustments */
    --marker;
    --llist;
    --qsize;
    --dhead;
    --perm;
    --invp;
    --adjncy;
    --xadj;

    /* Function Body */
    if (*neqns <= 0) {
	return 0;
    }

/*        ------------------------------------------------ */
/*        INITIALIZATION FOR THE MINIMUM DEGREE ALGORITHM. */
/*        ------------------------------------------------ */
    *nofsub = 0;
    slu_mmdint_(neqns, &xadj[1], &adjncy[1], &dhead[1], &invp[1], &perm[1], &
	    qsize[1], &llist[1], &marker[1]);

/*        ---------------------------------------------- */
/*        NUM COUNTS THE NUMBER OF ORDERED NODES PLUS 1. */
/*        ---------------------------------------------- */
    num = 1;

/*        ----------------------------- */
/*        ELIMINATE ALL ISOLATED NODES. */
/*        ----------------------------- */
    nextmd = dhead[1];
L100:
    if (nextmd <= 0) {
	goto L200;
    }
    mdnode = nextmd;
    nextmd = invp[mdnode];
    marker[mdnode] = *maxint;
    invp[mdnode] = -num;
    ++num;
    goto L100;

L200:
/*        ---------------------------------------- */
/*        SEARCH FOR NODE OF THE MINIMUM DEGREE. */
/*        MDEG IS THE CURRENT MINIMUM DEGREE; */
/*        TAG IS USED TO FACILITATE MARKING NODES. */
/*        ---------------------------------------- */
    if (num > *neqns) {
	goto L1000;
    }
    tag = 1;
    dhead[1] = 0;
    mdeg = 2;
L300:
    if (dhead[mdeg] > 0) {
	goto L400;
    }
    ++mdeg;
    goto L300;
L400:
/*            ------------------------------------------------- */
/*            USE VALUE OF DELTA TO SET UP MDLMT, WHICH GOVERNS */
/*            WHEN A DEGREE UPDATE IS TO BE PERFORMED. */
/*            ------------------------------------------------- */
    mdlmt = mdeg + *delta;
    ehead = 0;

L500:
    mdnode = dhead[mdeg];
    if (mdnode > 0) {
	goto L600;
    }
    ++mdeg;
    if (mdeg > mdlmt) {
	goto L900;
    }
    goto L500;
L600:
/*                ---------------------------------------- */
/*                REMOVE MDNODE FROM THE DEGREE STRUCTURE. */
/*                ---------------------------------------- */
    nextmd = invp[mdnode];
    dhead[mdeg] = nextmd;
    if (nextmd > 0) {
	perm[nextmd] = -mdeg;
    }
    invp[mdnode] = -num;
    *nofsub = *nofsub + mdeg + qsize[mdnode] - 2;
    if (num + qsize[mdnode] > *neqns) {
	goto L1000;
    }
/*                ---------------------------------------------- */
/*                ELIMINATE MDNODE AND PERFORM QUOTIENT GRAPH */
/*                TRANSFORMATION.  RESET TAG VALUE IF NECESSARY. */
/*                ---------------------------------------------- */
    ++tag;
    if (tag < *maxint) {
	goto L800;
    }
    tag = 1;
    i__1 = *neqns;
    for (i = 1; i <= i__1; ++i) {
	if (marker[i] < *maxint) {
	    marker[i] = 0;
	}
/* L700: */
    }
L800:
    slu_mmdelm_(&mdnode, &xadj[1], &adjncy[1], &dhead[1], &invp[1], &perm[1], &
	    qsize[1], &llist[1], &marker[1], maxint, &tag);
    num += qsize[mdnode];
    llist[mdnode] = ehead;
    ehead = mdnode;
    if (*delta >= 0) {
	goto L500;
    }
L900:
/*            ------------------------------------------- */
/*            UPDATE DEGREES OF THE NODES INVOLVED IN THE */
/*            MINIMUM DEGREE NODES ELIMINATION. */
/*            ------------------------------------------- */
    if (num > *neqns) {
	goto L1000;
    }
    slu_mmdupd_(&ehead, neqns, &xadj[1], &adjncy[1], delta, &mdeg, &dhead[1], &
	    invp[1], &perm[1], &qsize[1], &llist[1], &marker[1], maxint, &tag)
	    ;
    goto L300;

L1000:
    slu_mmdnum_(neqns, &perm[1], &invp[1], &qsize[1]);
    return 0;

}